

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetResMonParams(void *kinmem,sunrealtype omegamin,sunrealtype omegamax)

{
  KINMem in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x20c,"KINSetResMonParams",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      in_RDI->kin_omega_min = in_XMM0_Qa;
    }
    else {
      in_RDI->kin_omega_min = 1e-05;
    }
    if (0.0 <= in_XMM1_Qa) {
      if ((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) {
        if (in_XMM1_Qa < in_RDI->kin_omega_min) {
          KINProcessError(in_RDI,-2,0x235,"KINSetResMonParams",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                          ,"scalars < 0 illegal.");
          return -2;
        }
        in_RDI->kin_omega_max = in_XMM1_Qa;
      }
      else {
        if (0.9 < in_RDI->kin_omega_min) {
          KINProcessError(in_RDI,-2,0x22b,"KINSetResMonParams",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                          ,"scalars < 0 illegal.");
          return -2;
        }
        in_RDI->kin_omega_max = 0.9;
      }
      local_4 = 0;
    }
    else {
      KINProcessError(in_RDI,-2,0x222,"KINSetResMonParams",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                      ,"scalars < 0 illegal.");
      local_4 = -2;
    }
  }
  else {
    KINProcessError(in_RDI,-2,0x216,"KINSetResMonParams",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"scalars < 0 illegal.");
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int KINSetResMonParams(void* kinmem, sunrealtype omegamin, sunrealtype omegamax)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check omegamin */

  if (omegamin < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_OMEGA);
    return (KIN_ILL_INPUT);
  }

  if (omegamin == ZERO) { kin_mem->kin_omega_min = OMEGA_MIN; }
  else { kin_mem->kin_omega_min = omegamin; }

  /* check omegamax */

  if (omegamax < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_OMEGA);
    return (KIN_ILL_INPUT);
  }

  if (omegamax == ZERO)
  {
    if (kin_mem->kin_omega_min > OMEGA_MAX)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_OMEGA);
      return (KIN_ILL_INPUT);
    }
    else { kin_mem->kin_omega_max = OMEGA_MAX; }
  }
  else
  {
    if (kin_mem->kin_omega_min > omegamax)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_OMEGA);
      return (KIN_ILL_INPUT);
    }
    else { kin_mem->kin_omega_max = omegamax; }
  }

  return (KIN_SUCCESS);
}